

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

err_t bign96PubkeyCalc(octet *pubkey,bign_params *params,octet *privkey)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  word *b;
  word *stack;
  u64 *dest;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (params->l == 0x60) {
      sVar4 = bign96Start_keep(bign96PubkeyCalc_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bign96Start(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->n;
          bVar1 = memIsValid(privkey,0x18);
          eVar2 = 0x6d;
          if (bVar1 != 0) {
            bVar1 = memIsValid(pubkey,0x30);
            if (bVar1 != 0) {
              dest = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
              u64From(dest,privkey,0x18);
              bVar1 = wwIsZero(dest,sVar4);
              eVar2 = 0x1f8;
              if (bVar1 == 0) {
                iVar3 = wwCmp(dest,ec->order,sVar4);
                if (iVar3 < 0) {
                  b = dest + sVar4;
                  stack = b + sVar4 * 2;
                  bVar1 = ecMulA(b,ec->base,ec,dest,sVar4,stack);
                  if (bVar1 == 0) {
                    eVar2 = 0x1f6;
                  }
                  else {
                    (*ec->f->to)(pubkey,b,ec->f,stack);
                    (*ec->f->to)(pubkey + 0x18,b + sVar4,ec->f,stack);
                    eVar2 = 0;
                  }
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96PubkeyCalc(octet pubkey[48], const bign_params* params,
	const octet privkey[24])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96PubkeyCalc_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить открытый ключ
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + 24, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}